

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O0

value_t __thiscall
remove_edges_filtration::compute_filtration
          (remove_edges_filtration *this,unsigned_short dimension,
          directed_flag_complex_cell_t *param_3,filtered_directed_graph_t *param_4,
          value_t *boundary_filtration)

{
  runtime_error *this_00;
  ushort in_SI;
  float *in_R8;
  value_t local_4;
  
  if (in_SI == 0) {
    local_4 = 0.0;
  }
  else {
    if (in_SI == 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Please provide a graph with random weights on the edges.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = max<float_const*>(in_R8,0,(uint)in_SI);
  }
  return local_4;
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {

		if (dimension == 0) { return (0.0f); }

		if (dimension == 1) { throw std::runtime_error("Please provide a graph with random weights on the edges."); }
		return (max(boundary_filtration, 0, dimension));
	}